

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O1

void __thiscall WorkerThread::WorkerThread(WorkerThread *this)

{
  long *local_30;
  thread local_28;
  
  *(undefined8 *)((long)&(this->taskMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->taskMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->taskMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->taskMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->taskMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->workerThread)._M_id._M_thread = 0;
  (this->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::condition_variable::condition_variable(&this->taskCV);
  LOCK();
  (this->stopMe)._M_base._M_i = false;
  UNLOCK();
  this->taskPresence = false;
  local_28._M_id._M_thread = (id)0;
  local_30 = (long *)operator_new(0x10);
  *local_30 = (long)&PTR___State_00110cd0;
  local_30[1] = (long)this;
  std::thread::_M_start_thread(&local_28,&local_30,0);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  if ((this->workerThread)._M_id._M_thread == 0) {
    (this->workerThread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

WorkerThread::WorkerThread () {
	stopMe			= false;
	taskPresence	= false;
	workerThread	= std::thread ([&] {
		workerFunction ();
	});
}